

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeArray(ExpressionContext *ctx,SynArray *syntax)

{
  char *pcVar1;
  char *pcVar2;
  IntrusiveList<ExprBase> values_00;
  IntrusiveList<ExprBase> values_01;
  IntrusiveList<ExprBase> values_02;
  Allocator *pAVar3;
  bool bVar4;
  uint uVar5;
  ExprBase **ppEVar6;
  ExprError *this;
  TypeBase *pTVar7;
  ExprBase *pEVar8;
  TypeClass *pTVar9;
  TypeArray *type;
  TypeClass *typeClass;
  ExprError *local_2c8;
  ExprBase *value_1;
  TypeBase *pTStack_2b8;
  uint i_1;
  TypeBase *subType;
  IntrusiveList<ExprBase> values;
  uint local_27c;
  undefined1 auStack_278 [4];
  uint i;
  IntrusiveList<ExprBase> values_1;
  TypeArray *arrayType;
  ExprBase *local_250;
  ExprBase *value;
  SynBase *el;
  TypeBase *nestedUnsizedType;
  SmallArray<ExprBase_*,_64U> raw;
  SynArray *syntax_local;
  ExpressionContext *ctx_local;
  
  raw.allocator = (Allocator *)syntax;
  if ((syntax->values).head == (SynBase *)0x0) {
    __assert_fail("syntax->values.head",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0xf28,"ExprBase *AnalyzeArray(ExpressionContext &, SynArray *)");
  }
  SmallArray<ExprBase_*,_64U>::SmallArray
            ((SmallArray<ExprBase_*,_64U> *)&nestedUnsizedType,ctx->allocator);
  el = (SynBase *)0x0;
  for (value = (ExprBase *)raw.allocator[8]._vptr_Allocator; value != (ExprBase *)0x0;
      value = (ExprBase *)value[1]._vptr_ExprBase) {
    local_250 = AnalyzeExpression(ctx,(SynBase *)value);
    bVar4 = SmallArray<ExprBase_*,_64U>::empty((SmallArray<ExprBase_*,_64U> *)&nestedUnsizedType);
    if ((!bVar4) &&
       (ppEVar6 = SmallArray<ExprBase_*,_64U>::operator[]
                            ((SmallArray<ExprBase_*,_64U> *)&nestedUnsizedType,0),
       (*ppEVar6)->type != local_250->type)) {
      ppEVar6 = SmallArray<ExprBase_*,_64U>::operator[]
                          ((SmallArray<ExprBase_*,_64U> *)&nestedUnsizedType,0);
      values_1.tail = (ExprBase *)getType<TypeArray>((*ppEVar6)->type);
      if ((TypeArray *)values_1.tail != (TypeArray *)0x0) {
        el = (SynBase *)
             ExpressionContext::GetUnsizedArrayType(ctx,((TypeArray *)values_1.tail)->subType);
      }
    }
    SmallArray<ExprBase_*,_64U>::push_back
              ((SmallArray<ExprBase_*,_64U> *)&nestedUnsizedType,&local_250);
  }
  bVar4 = SmallArray<ExprBase_*,_64U>::empty((SmallArray<ExprBase_*,_64U> *)&nestedUnsizedType);
  if (!bVar4) {
    ppEVar6 = SmallArray<ExprBase_*,_64U>::operator[]
                        ((SmallArray<ExprBase_*,_64U> *)&nestedUnsizedType,0);
    bVar4 = isType<TypeError>((*ppEVar6)->type);
    if (bVar4) {
      IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)auStack_278);
      for (local_27c = 0;
          uVar5 = SmallArray<ExprBase_*,_64U>::size
                            ((SmallArray<ExprBase_*,_64U> *)&nestedUnsizedType), local_27c < uVar5;
          local_27c = local_27c + 1) {
        ppEVar6 = SmallArray<ExprBase_*,_64U>::operator[]
                            ((SmallArray<ExprBase_*,_64U> *)&nestedUnsizedType,local_27c);
        IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)auStack_278,*ppEVar6);
      }
      ctx_local = (ExpressionContext *)ExpressionContext::get<ExprArray>(ctx);
      pAVar3 = raw.allocator;
      pTVar7 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      values_02.tail = values_1.head;
      values_02.head = _auStack_278;
      ExprArray::ExprArray((ExprArray *)ctx_local,(SynBase *)pAVar3,pTVar7,values_02);
      goto LAB_001959b2;
    }
  }
  IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)&subType);
  pTStack_2b8 = (TypeBase *)0x0;
  for (value_1._4_4_ = 0;
      uVar5 = SmallArray<ExprBase_*,_64U>::size((SmallArray<ExprBase_*,_64U> *)&nestedUnsizedType),
      value_1._4_4_ < uVar5; value_1._4_4_ = value_1._4_4_ + 1) {
    ppEVar6 = SmallArray<ExprBase_*,_64U>::operator[]
                        ((SmallArray<ExprBase_*,_64U> *)&nestedUnsizedType,value_1._4_4_);
    local_2c8 = (ExprError *)*ppEVar6;
    if (el != (SynBase *)0x0) {
      local_2c8 = (ExprError *)
                  CreateCast(ctx,(local_2c8->super_ExprBase).source,(ExprBase *)local_2c8,
                             (TypeBase *)el,false);
    }
    if (pTStack_2b8 == (TypeBase *)0x0) {
      pTStack_2b8 = (local_2c8->super_ExprBase).type;
    }
    else if (pTStack_2b8 != (local_2c8->super_ExprBase).type) {
      bVar4 = ExpressionContext::IsIntegerType(ctx,(local_2c8->super_ExprBase).type);
      if ((bVar4) && (bVar4 = ExpressionContext::IsFloatingPointType(ctx,pTStack_2b8), bVar4)) {
        local_2c8 = (ExprError *)
                    CreateCast(ctx,(local_2c8->super_ExprBase).source,&local_2c8->super_ExprBase,
                               pTStack_2b8,false);
      }
      else {
        bVar4 = ExpressionContext::IsIntegerType(ctx,(local_2c8->super_ExprBase).type);
        if (((bVar4) && (bVar4 = ExpressionContext::IsIntegerType(ctx,pTStack_2b8), bVar4)) &&
           (((local_2c8->super_ExprBase).type)->size < pTStack_2b8->size)) {
          local_2c8 = (ExprError *)
                      CreateCast(ctx,(local_2c8->super_ExprBase).source,&local_2c8->super_ExprBase,
                                 pTStack_2b8,false);
        }
        else {
          bVar4 = ExpressionContext::IsFloatingPointType(ctx,(local_2c8->super_ExprBase).type);
          if (((bVar4) && (bVar4 = ExpressionContext::IsFloatingPointType(ctx,pTStack_2b8), bVar4))
             && (((local_2c8->super_ExprBase).type)->size < pTStack_2b8->size)) {
            local_2c8 = (ExprError *)
                        CreateCast(ctx,(local_2c8->super_ExprBase).source,&local_2c8->super_ExprBase
                                   ,pTStack_2b8,false);
          }
          else {
            bVar4 = isType<TypeError>((local_2c8->super_ExprBase).type);
            if (!bVar4) {
              pTVar7 = (local_2c8->super_ExprBase).type;
              pcVar1 = (pTVar7->name).begin;
              pcVar2 = (pTStack_2b8->name).begin;
              local_2c8 = anon_unknown.dwarf_6f1cc::ReportExpected
                                    (ctx,(local_2c8->super_ExprBase).source,pTVar7,
                                     "ERROR: array element %d type \'%.*s\' doesn\'t match \'%.*s\'"
                                     ,(ulong)(value_1._4_4_ + 1),
                                     (ulong)(uint)(*(int *)&(pTVar7->name).end - (int)pcVar1),pcVar1
                                     ,*(int *)&(pTStack_2b8->name).end - (int)pcVar2,pcVar2);
            }
          }
        }
      }
    }
    if ((local_2c8->super_ExprBase).type == ctx->typeVoid) {
      anon_unknown.dwarf_6f1cc::Stop
                (ctx,(local_2c8->super_ExprBase).source,
                 "ERROR: array cannot be constructed from void type elements");
    }
    bVar4 = AssertValueExpression(ctx,(local_2c8->super_ExprBase).source,&local_2c8->super_ExprBase)
    ;
    if (!bVar4) {
      this = ExpressionContext::get<ExprError>(ctx);
      pAVar3 = raw.allocator;
      pTVar7 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      ExprError::ExprError(this,(SynBase *)pAVar3,pTVar7,&local_2c8->super_ExprBase);
      local_2c8 = this;
    }
    IntrusiveList<ExprBase>::push_back
              ((IntrusiveList<ExprBase> *)&subType,&local_2c8->super_ExprBase);
  }
  bVar4 = IntrusiveList<ExprBase>::empty((IntrusiveList<ExprBase> *)&subType);
  if (!bVar4) {
    pEVar8 = IntrusiveList<ExprBase>::operator[]((IntrusiveList<ExprBase> *)&subType,0);
    bVar4 = isType<TypeError>(pEVar8->type);
    if (bVar4) {
      ctx_local = (ExpressionContext *)ExpressionContext::get<ExprArray>(ctx);
      pAVar3 = raw.allocator;
      pTVar7 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      values_01.tail = values.head;
      values_01.head = (ExprBase *)subType;
      ExprArray::ExprArray((ExprArray *)ctx_local,(SynBase *)pAVar3,pTVar7,values_01);
      goto LAB_001959b2;
    }
  }
  pTVar9 = getType<TypeClass>(pTStack_2b8);
  if ((pTVar9 != (TypeClass *)0x0) && ((pTVar9->hasFinalizer & 1U) != 0)) {
    anon_unknown.dwarf_6f1cc::Stop
              (ctx,(SynBase *)raw.allocator,
               "ERROR: class \'%.*s\' implements \'finalize\' so only an unsized array type can be created"
               ,(ulong)(uint)(*(int *)&(pTStack_2b8->name).end - (int)(pTStack_2b8->name).begin));
  }
  if (0xffff < pTStack_2b8->size) {
    anon_unknown.dwarf_6f1cc::Stop
              (ctx,(SynBase *)raw.allocator,"ERROR: array element size cannot exceed 65535 bytes");
  }
  ctx_local = (ExpressionContext *)ExpressionContext::get<ExprArray>(ctx);
  pAVar3 = raw.allocator;
  uVar5 = IntrusiveList<ExprBase>::size((IntrusiveList<ExprBase> *)&subType);
  type = ExpressionContext::GetArrayType(ctx,pTStack_2b8,(ulong)uVar5);
  values_00.tail = values.head;
  values_00.head = (ExprBase *)subType;
  ExprArray::ExprArray((ExprArray *)ctx_local,(SynBase *)pAVar3,&type->super_TypeBase,values_00);
LAB_001959b2:
  values.tail._4_4_ = 1;
  SmallArray<ExprBase_*,_64U>::~SmallArray((SmallArray<ExprBase_*,_64U> *)&nestedUnsizedType);
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* AnalyzeArray(ExpressionContext &ctx, SynArray *syntax)
{
	assert(syntax->values.head);

	SmallArray<ExprBase*, 64> raw(ctx.allocator);

	TypeBase *nestedUnsizedType = NULL;

	for(SynBase *el = syntax->values.head; el; el = el->next)
	{
		ExprBase *value = AnalyzeExpression(ctx, el);

		if(!raw.empty() && raw[0]->type != value->type)
		{
			if(TypeArray *arrayType = getType<TypeArray>(raw[0]->type))
				nestedUnsizedType = ctx.GetUnsizedArrayType(arrayType->subType);
		}

		raw.push_back(value);
	}

	// First value type is required to complete array definition
	if(!raw.empty() && isType<TypeError>(raw[0]->type))
	{
		IntrusiveList<ExprBase> values;

		for(unsigned i = 0; i < raw.size(); i++)
			values.push_back(raw[i]);

		return new (ctx.get<ExprArray>()) ExprArray(syntax, ctx.GetErrorType(), values);
	}

	IntrusiveList<ExprBase> values;

	TypeBase *subType = NULL;

	for(unsigned i = 0; i < raw.size(); i++)
	{
		ExprBase *value = raw[i];

		if(nestedUnsizedType)
			value = CreateCast(ctx, value->source, value, nestedUnsizedType, false);

		if(subType == NULL)
		{
			subType = value->type;
		}
		else if(subType != value->type)
		{
			// Allow numeric promotion
			if(ctx.IsIntegerType(value->type) && ctx.IsFloatingPointType(subType))
				value = CreateCast(ctx, value->source, value, subType, false);
			else if(ctx.IsIntegerType(value->type) && ctx.IsIntegerType(subType) && subType->size > value->type->size)
				value = CreateCast(ctx, value->source, value, subType, false);
			else if(ctx.IsFloatingPointType(value->type) && ctx.IsFloatingPointType(subType) && subType->size > value->type->size)
				value = CreateCast(ctx, value->source, value, subType, false);
			else if(!isType<TypeError>(value->type))
				value = ReportExpected(ctx, value->source, value->type, "ERROR: array element %d type '%.*s' doesn't match '%.*s'", i + 1, FMT_ISTR(value->type->name), FMT_ISTR(subType->name));
		}

		if(value->type == ctx.typeVoid)
			Stop(ctx, value->source, "ERROR: array cannot be constructed from void type elements");

		if(!AssertValueExpression(ctx, value->source, value))
			value = new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), value);

		values.push_back(value);
	}

	if(!values.empty() && isType<TypeError>(values[0]->type))
		return new (ctx.get<ExprArray>()) ExprArray(syntax, ctx.GetErrorType(), values);

	if(TypeClass *typeClass = getType<TypeClass>(subType))
	{
		if(typeClass->hasFinalizer)
			Stop(ctx, syntax, "ERROR: class '%.*s' implements 'finalize' so only an unsized array type can be created", FMT_ISTR(subType->name));
	}

	if(subType->size >= 64 * 1024)
		Stop(ctx, syntax, "ERROR: array element size cannot exceed 65535 bytes");

	return new (ctx.get<ExprArray>()) ExprArray(syntax, ctx.GetArrayType(subType, values.size()), values);
}